

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

bool __thiscall
llama_model_loader::get_key<bool>(llama_model_loader *this,llm_kv kid,bool *result,bool required)

{
  bool bVar1;
  string local_40;
  
  LLM_KV::operator()[abi_cxx11_(&local_40,&this->llm_kv,kid);
  bVar1 = get_key<bool>(this,&local_40,result,required);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool llama_model_loader::get_key(enum llm_kv kid, T & result, bool required) {
        return get_key(llm_kv(kid), result, required);
    }